

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::isAuxiliary(TQualifier *this)

{
  bool local_11;
  TQualifier *this_local;
  
  local_11 = true;
  if (((((*(ulong *)&this->field_0x8 >> 0x1d & 1) == 0) &&
       (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x2c & 1) == 0)) &&
      (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x2d & 1) == 0)) &&
     (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x27 & 1) == 0)) {
    local_11 = (bool)((byte)((ulong)*(undefined8 *)&this->field_0x8 >> 0x28) & 1);
  }
  return local_11;
}

Assistant:

bool isAuxiliary() const
    {
        return centroid || patch || sample || pervertexNV || pervertexEXT;
    }